

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

void tok_add_define(tokcxdef *ctx,char *sym,int len,char *expan,int explen)

{
  uint uVar1;
  tokdfdef *ptVar2;
  size_t __n;
  
  ptVar2 = tok_find_define(ctx,sym,len);
  if (ptVar2 == (tokdfdef *)0x0) {
    uVar1 = tokdfhsh(sym,len);
    __n = (size_t)explen;
    ptVar2 = (tokdfdef *)mchalo(ctx->tokcxerr,(long)len + __n + 0x1f,"tok_add_define");
    ptVar2->nm = ptVar2->expan + __n;
    ptVar2->len = len;
    ptVar2->explen = explen;
    memcpy(ptVar2->expan,expan,__n);
    memcpy(ptVar2->expan + __n,sym,(long)len);
    ptVar2->nxt = ctx->tokcxdf[uVar1];
    ctx->tokcxdf[uVar1] = ptVar2;
  }
  return;
}

Assistant:

void tok_add_define(tokcxdef *ctx, char *sym, int len,
                    char *expan, int explen)
{
    int       hsh;
    tokdfdef *df;

    /* if it's already defined, ignore it */
    if (tok_find_define(ctx, sym, len))
        return;

    /* find the appropriate entry in the hash table */
    hsh = tokdfhsh(sym, len);

    /* allocate space for the symbol */
    df = (tokdfdef *)mchalo(ctx->tokcxerr,
                            (sizeof(tokdfdef) + len + explen - 1),
                            "tok_add_define");

    /* set up the new symbol */
    df->nm = df->expan + explen;
    df->len = len;
    df->explen = explen;
    memcpy(df->expan, expan, explen);
    memcpy(df->nm, sym, len);

    /* link it into the hash chain */
    df->nxt = ctx->tokcxdf[hsh];
    ctx->tokcxdf[hsh] = df;
}